

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.cpp
# Opt level: O0

int __thiscall CSnapshot::Serialize(CSnapshot *this,char *pDstData)

{
  int *in_RSI;
  int *in_RDI;
  int *pData;
  void *in_stack_ffffffffffffffc8;
  CSnapshot *this_00;
  
  *in_RSI = *in_RDI;
  in_RSI[1] = in_RDI[1];
  this_00 = (CSnapshot *)(in_RSI + 2);
  Offsets(this_00);
  mem_copy(this_00,in_stack_ffffffffffffffc8,0);
  DataStart(this_00);
  mem_copy(this_00,in_stack_ffffffffffffffc8,0);
  return (in_RDI[1] + 2) * 4 + *in_RDI;
}

Assistant:

int CSnapshot::Serialize(char *pDstData) const
{
	int *pData = (int*)pDstData;
	pData[0] = m_DataSize;
	pData[1] = m_NumItems;

	mem_copy(pData+2, Offsets(), sizeof(int)*m_NumItems);
	mem_copy(pData+2+m_NumItems, DataStart(), m_DataSize);

	return sizeof(int) * (2 + m_NumItems) + m_DataSize;
}